

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
          *value)

{
  void *pvVar1;
  Nullable<const_char_*> pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  TestAllTypes_NestedMessage **v1;
  void **ppvVar6;
  char *failure_msg;
  LogMessage *pLVar7;
  Rep *pRVar8;
  LogMessage local_40;
  Voidify local_29;
  void *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *value_local;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)value;
  value_local = (Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
                 *)this;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestAllTypes_NestedMessage*>
                 ((TestAllTypes_NestedMessage **)&absl_log_internal_check_op_result);
  local_28 = (void *)0x0;
  ppvVar6 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_20 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestAllTypes_NestedMessage*,decltype(nullptr)>
                       (v1,ppvVar6,"value != nullptr");
  if (local_20 == (Nullable<const_char_*>)0x0) {
    bVar3 = SizeAtCapacity(this);
    if (bVar3) {
      InternalExtend(this,1);
      pRVar8 = rep(this);
      pRVar8->allocated_size = pRVar8->allocated_size + 1;
    }
    else {
      bVar3 = AllocatedSizeAtCapacity(this);
      if (bVar3) {
        ppvVar6 = element_at(this,this->current_size_);
        Delete<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                  (*ppvVar6,this->arena_);
      }
      else {
        iVar5 = this->current_size_;
        iVar4 = allocated_size(this);
        if (iVar5 < iVar4) {
          ppvVar6 = element_at(this,this->current_size_);
          pvVar1 = *ppvVar6;
          iVar5 = allocated_size(this);
          ppvVar6 = element_at(this,iVar5);
          *ppvVar6 = pvVar1;
          pRVar8 = rep(this);
          pRVar8->allocated_size = pRVar8->allocated_size + 1;
        }
        else {
          bVar3 = using_sso(this);
          if (!bVar3) {
            pRVar8 = rep(this);
            pRVar8->allocated_size = pRVar8->allocated_size + 1;
          }
        }
      }
    }
    pcVar2 = absl_log_internal_check_op_result;
    iVar5 = ExchangeCurrentSize(this,this->current_size_ + 1);
    ppvVar6 = element_at(this,iVar5);
    *ppvVar6 = pcVar2;
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x1d0,failure_msg);
  pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar7);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void UnsafeArenaAddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    // Make room for the new pointer.
    if (SizeAtCapacity()) {
      // The array is completely full with no cleared objects, so grow it.
      InternalExtend(1);
      ++rep()->allocated_size;
    } else if (AllocatedSizeAtCapacity()) {
      // There is no more space in the pointer array because it contains some
      // cleared objects awaiting reuse.  We don't want to grow the array in
      // this case because otherwise a loop calling AddAllocated() followed by
      // Clear() would leak memory.
      using H = CommonHandler<TypeHandler>;
      Delete<H>(element_at(current_size_), arena_);
    } else if (current_size_ < allocated_size()) {
      // We have some cleared objects.  We don't care about their order, so we
      // can just move the first one to the end to make space.
      element_at(allocated_size()) = element_at(current_size_);
      ++rep()->allocated_size;
    } else {
      // There are no cleared objects.
      if (!using_sso()) ++rep()->allocated_size;
    }

    element_at(ExchangeCurrentSize(current_size_ + 1)) = value;
  }